

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool socks_proxy_info_matches(proxy_info *data,proxy_info *needle)

{
  _Bool _Var1;
  int iVar2;
  proxy_info *needle_local;
  proxy_info *data_local;
  
  _Var1 = proxy_info_matches(data,needle);
  if (((_Var1) && (iVar2 = Curl_timestrcmp(data->user,needle->user), iVar2 == 0)) &&
     (iVar2 = Curl_timestrcmp(data->passwd,needle->passwd), iVar2 == 0)) {
    return true;
  }
  return false;
}

Assistant:

static bool
socks_proxy_info_matches(const struct proxy_info *data,
                         const struct proxy_info *needle)
{
  if(!proxy_info_matches(data, needle))
    return FALSE;

  /* the user information is case-sensitive
     or at least it is not defined as case-insensitive
     see https://datatracker.ietf.org/doc/html/rfc3986#section-3.2.1 */

  /* curl_strequal does a case insensitive comparison,
     so do not use it here! */
  if(Curl_timestrcmp(data->user, needle->user) ||
     Curl_timestrcmp(data->passwd, needle->passwd))
    return FALSE;
  return TRUE;
}